

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O1

void __thiscall
FZFile::parse(FZFile *this,vector<char,_std::allocator<char>_> *buf,array<unsigned_int,_44UL> *fzkey
             )

{
  pointer *ppBVar1;
  pointer *ppBVar2;
  byte bVar3;
  BRDPartMountingSide BVar4;
  pointer __src;
  iterator __position;
  iterator __position_00;
  pointer pbVar5;
  char *pcVar6;
  pointer pBVar7;
  double dVar8;
  double dVar9;
  bool bVar10;
  int iVar11;
  char *pcVar12;
  vector<char,_std::allocator<char>_> *buffer;
  size_t sVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  mapped_type *pmVar15;
  pointer extraout_RAX;
  uint *puVar16;
  size_t sVar17;
  pointer extraout_RAX_00;
  pointer extraout_RAX_01;
  long lVar18;
  long *plVar19;
  undefined8 *puVar20;
  iterator iVar21;
  BRDPoint *pBVar22;
  undefined8 uVar23;
  ulong *puVar24;
  _func_int **pp_Var25;
  char **ppcVar26;
  size_type *psVar27;
  BRDPoint BVar28;
  byte *pbVar29;
  size_t __n;
  array<unsigned_int,_44UL> *extraout_RDX;
  array<unsigned_int,_44UL> *extraout_RDX_00;
  array<unsigned_int,_44UL> *paVar30;
  array<unsigned_int,_44UL> *fzkey_00;
  uint uVar31;
  string *psVar32;
  pointer pFVar33;
  pointer ppcVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  pointer pBVar38;
  pointer pBVar39;
  byte *pbVar40;
  pointer pbVar41;
  pointer ppcVar42;
  FZFile *this_00;
  BRDNail nail;
  char *p;
  string __str;
  char *p_1;
  char *s;
  char *arena_end;
  BRDPart part;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  parts_id;
  char *arena;
  size_t descr_size;
  size_t content_size;
  vector<char_*,_std::allocator<char_*>_> lines_descr;
  vector<char_*,_std::allocator<char_*>_> lines_content;
  undefined1 local_2a8 [32];
  undefined1 local_288 [16];
  undefined1 local_278 [64];
  long local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  byte *local_200;
  undefined1 local_1f8 [16];
  _func_int *local_1e8;
  undefined1 auStack_1e0 [16];
  pointer local_1d0;
  BRDPoint local_1c8;
  pointer ppStack_1c0;
  FZFile *local_1b8;
  pointer local_1b0;
  undefined1 local_1a8 [24];
  undefined1 auStack_190 [36];
  BRDPoint BStack_16c;
  undefined1 local_160 [32];
  float local_140;
  pointer local_138;
  pointer pFStack_130;
  pointer local_128;
  pointer local_120;
  pointer local_118;
  string *local_110;
  size_t local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  long local_f0;
  ulong local_e8 [2];
  vector<char_*,_std::allocator<char_*>_> local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  vector<char_*,_std::allocator<char_*>_> local_98;
  vector<BRDPin,std::allocator<BRDPin>> *local_80;
  vector<BRDNail,std::allocator<BRDNail>> *local_78;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_70;
  pointer local_68;
  FZFile *local_60;
  char *local_58;
  string local_50;
  pointer pBVar14;
  
  uVar37 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_58 = setlocale(1,"C");
  bVar10 = check_fz_key<44ul>(this,fzkey);
  paVar30 = &this->key;
  if (bVar10) {
    memcpy(paVar30,fzkey,0xb0);
  }
  else {
    bVar10 = check_fz_key<44ul>(this,paVar30);
    if (!bVar10) {
      (this->super_BRDFileBase).valid = false;
      (*(this->super_BRDFileBase)._vptr_BRDFileBase[3])(local_1a8,this);
      psVar32 = &(this->super_BRDFileBase).error_msg;
      std::__cxx11::string::_M_assign((string *)psVar32);
      paVar30 = extraout_RDX;
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        paVar30 = extraout_RDX_00;
      }
      fz_key_to_string<44ul>((string *)local_1a8,(FZFile *)fzkey,paVar30);
      std::__cxx11::string::_M_append((char *)psVar32,local_1a8._0_8_);
      if (local_1a8._0_8_ == (long)local_1a8 + 0x10) {
        return;
      }
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      return;
    }
  }
  local_1b8 = this;
  if (uVar37 < 5) {
    auStack_1e0._8_8_ = &local_1c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(auStack_1e0 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
               ,"");
    plVar19 = (long *)std::__cxx11::string::append(auStack_1e0 + 8);
    puVar24 = (ulong *)(plVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar19 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_230._M_allocated_capacity = *puVar24;
      local_230._8_8_ = plVar19[3];
      local_278._56_8_ = &local_230;
    }
    else {
      local_230._M_allocated_capacity = *puVar24;
      local_278._56_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar19;
    }
    local_238 = plVar19[1];
    *plVar19 = (long)puVar24;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    local_278._24_8_ = local_278 + 0x28;
    std::__cxx11::string::_M_construct((ulong)(local_278 + 0x18),'\x03');
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_278._24_8_,3,0xe5);
    uVar23 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._56_8_ != &local_230) {
      uVar23 = local_230._M_allocated_capacity;
    }
    if ((ulong)uVar23 < (ulong)(local_278._32_8_ + local_238)) {
      uVar37 = 0xf;
      if ((undefined1 *)local_278._24_8_ != local_278 + 0x28) {
        uVar37 = local_278._40_8_;
      }
      if (uVar37 < (ulong)(local_278._32_8_ + local_238)) goto LAB_001465d2;
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)(local_278 + 0x18),0,(char *)0x0,local_278._56_8_);
    }
    else {
LAB_001465d2:
      puVar20 = (undefined8 *)std::__cxx11::string::_M_append(local_278 + 0x38,local_278._24_8_);
    }
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    psVar27 = puVar20 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar20 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar27) {
      local_220.field_2._M_allocated_capacity = *psVar27;
      local_220.field_2._8_8_ = puVar20[3];
    }
    else {
      local_220.field_2._M_allocated_capacity = *psVar27;
      local_220._M_dataplus._M_p = (pointer)*puVar20;
    }
    local_220._M_string_length = puVar20[1];
    *puVar20 = psVar27;
    puVar20[1] = 0;
    *(undefined1 *)psVar27 = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_1f8._0_8_ = &local_1e8;
    pp_Var25 = (_func_int **)(plVar19 + 2);
    if ((_func_int **)*plVar19 == pp_Var25) {
      local_1e8 = *pp_Var25;
      auStack_1e0._0_8_ = plVar19[3];
    }
    else {
      local_1e8 = *pp_Var25;
      local_1f8._0_8_ = (_func_int **)*plVar19;
    }
    local_1f8._8_8_ = plVar19[1];
    *plVar19 = (long)pp_Var25;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append(local_1f8);
    local_288._0_8_ = local_278;
    pbVar41 = (pointer)(plVar19 + 2);
    if ((pointer)*plVar19 == pbVar41) {
      local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
      local_278._8_8_ = plVar19[3];
    }
    else {
      local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
      local_288._0_8_ = (pointer)*plVar19;
    }
    local_288._8_8_ = plVar19[1];
    *plVar19 = (long)pbVar41;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append(local_288);
    ppcVar26 = (char **)(plVar19 + 2);
    if ((char **)*plVar19 == ppcVar26) {
      local_2a8._16_8_ = *ppcVar26;
      local_2a8._24_8_ = plVar19[3];
      local_2a8._0_8_ = local_2a8 + 0x10;
    }
    else {
      local_2a8._16_8_ = *ppcVar26;
      local_2a8._0_8_ = (char **)*plVar19;
    }
    local_2a8._8_8_ = plVar19[1];
    *plVar19 = (long)ppcVar26;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append(local_2a8);
    psVar27 = (size_type *)(plVar19 + 2);
    if ((size_type *)*plVar19 == psVar27) {
      local_160._16_8_ = *psVar27;
      local_160._24_8_ = plVar19[3];
      local_160._0_8_ = local_160 + 0x10;
    }
    else {
      local_160._16_8_ = *psVar27;
      local_160._0_8_ = (size_type *)*plVar19;
    }
    local_160._8_8_ = plVar19[1];
    *plVar19 = (long)psVar27;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    pBVar22 = (BRDPoint *)std::__cxx11::string::append(local_160);
    BVar28 = (BRDPoint)(pBVar22 + 2);
    if (*pBVar22 == BVar28) {
      local_1a8._16_8_ = *(undefined8 *)BVar28;
      auStack_190._0_8_ = pBVar22[3];
      local_1a8._0_8_ = (long)local_1a8 + 0x10;
    }
    else {
      local_1a8._16_8_ = *(undefined8 *)BVar28;
      local_1a8._0_8_ = *pBVar22;
    }
    local_1a8._8_8_ = pBVar22[1];
    *pBVar22 = BVar28;
    pBVar22[1].x = 0;
    pBVar22[1].y = 0;
    *(undefined1 *)&pBVar22[2].x = 0;
    psVar32 = &(local_1b8->super_BRDFileBase).error_msg;
    std::__cxx11::string::operator=((string *)psVar32,(string *)local_1a8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    bVar10 = (undefined1 *)local_2a8._0_8_ == local_2a8 + 0x10;
LAB_00146878:
    if (!bVar10) {
LAB_0014687f:
      operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
    }
LAB_0014688c:
    bVar10 = (pointer)local_288._0_8_ == (pointer)local_278;
LAB_001482f0:
    if (!bVar10) {
      operator_delete((void *)local_288._0_8_,(ulong)(local_278._0_8_ + 1));
    }
    if ((_func_int **)local_1f8._0_8_ != &local_1e8) {
      operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_278._24_8_ != local_278 + 0x28) {
      operator_delete((void *)local_278._24_8_,local_278._40_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._56_8_ != &local_230) {
LAB_0014836b:
      operator_delete((void *)local_278._56_8_,local_230._M_allocated_capacity + 1);
    }
LAB_00148378:
    if ((BRDPoint *)auStack_1e0._8_8_ == &local_1c8) goto LAB_00148395;
  }
  else {
    sVar17 = (uVar37 + 1) * 3;
    local_60 = (FZFile *)paVar30;
    pcVar12 = (char *)calloc(1,sVar17);
    (this->super_BRDFileBase).file_buf = pcVar12;
    if (pcVar12 == (char *)0x0) {
      auStack_1e0._8_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1e0 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1e0 + 8);
      puVar24 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_230._M_allocated_capacity = *puVar24;
        local_230._8_8_ = puVar20[3];
        local_278._56_8_ = &local_230;
      }
      else {
        local_230._M_allocated_capacity = *puVar24;
        local_278._56_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar20;
      }
      local_238 = puVar20[1];
      *puVar20 = puVar24;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      local_278._24_8_ = local_278 + 0x28;
      std::__cxx11::string::_M_construct((ulong)(local_278 + 0x18),'\x03');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_278._24_8_,3,0xe8);
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._56_8_ != &local_230) {
        uVar23 = local_230._M_allocated_capacity;
      }
      if ((ulong)uVar23 < (ulong)(local_278._32_8_ + local_238)) {
        uVar37 = 0xf;
        if ((undefined1 *)local_278._24_8_ != local_278 + 0x28) {
          uVar37 = local_278._40_8_;
        }
        if (uVar37 < (ulong)(local_278._32_8_ + local_238)) goto LAB_00148029;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)(local_278 + 0x18),0,(char *)0x0,local_278._56_8_);
      }
      else {
LAB_00148029:
        puVar20 = (undefined8 *)std::__cxx11::string::_M_append(local_278 + 0x38,local_278._24_8_);
      }
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      psVar27 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar27) {
        local_220.field_2._M_allocated_capacity = *psVar27;
        local_220.field_2._8_8_ = puVar20[3];
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar27;
        local_220._M_dataplus._M_p = (pointer)*puVar20;
      }
      local_220._M_string_length = puVar20[1];
      *puVar20 = psVar27;
      puVar20[1] = 0;
      *(undefined1 *)psVar27 = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
      local_1f8._0_8_ = &local_1e8;
      pp_Var25 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var25) {
        local_1e8 = *pp_Var25;
        auStack_1e0._0_8_ = puVar20[3];
      }
      else {
        local_1e8 = *pp_Var25;
        local_1f8._0_8_ = (_func_int **)*puVar20;
      }
      local_1f8._8_8_ = puVar20[1];
      *puVar20 = pp_Var25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append(local_1f8);
      local_288._0_8_ = local_278;
      pbVar41 = (pointer)(plVar19 + 2);
      if ((pointer)*plVar19 == pbVar41) {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_278._8_8_ = plVar19[3];
      }
      else {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_288._0_8_ = (pointer)*plVar19;
      }
      local_288._8_8_ = plVar19[1];
      *plVar19 = (long)pbVar41;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_288);
      local_2a8._0_8_ = local_2a8 + 0x10;
      ppcVar26 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar26) {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._24_8_ = puVar20[3];
      }
      else {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._0_8_ = (char **)*puVar20;
      }
      local_2a8._8_8_ = puVar20[1];
      *puVar20 = ppcVar26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append(local_2a8);
      local_160._0_8_ = local_160 + 0x10;
      psVar27 = (size_type *)(plVar19 + 2);
      if ((size_type *)*plVar19 == psVar27) {
        local_160._16_8_ = *psVar27;
        local_160._24_8_ = plVar19[3];
      }
      else {
        local_160._16_8_ = *psVar27;
        local_160._0_8_ = (size_type *)*plVar19;
      }
      local_160._8_8_ = plVar19[1];
      *plVar19 = (long)psVar27;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      pBVar22 = (BRDPoint *)std::__cxx11::string::append(local_160);
LAB_0014821d:
      BVar28 = (BRDPoint)(pBVar22 + 2);
      if (*pBVar22 == BVar28) {
        local_1a8._16_8_ = *(undefined8 *)BVar28;
        auStack_190._0_8_ = pBVar22[3];
        local_1a8._0_8_ = (long)local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *(undefined8 *)BVar28;
        local_1a8._0_8_ = *pBVar22;
      }
      local_1a8._8_8_ = pBVar22[1];
      *pBVar22 = BVar28;
      pBVar22[1].x = 0;
      pBVar22[1].y = 0;
      *(undefined1 *)&pBVar22[2].x = 0;
      psVar32 = &(local_1b8->super_BRDFileBase).error_msg;
      std::__cxx11::string::operator=((string *)psVar32,(string *)local_1a8);
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
        operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
      }
      bVar10 = (pointer)local_288._0_8_ == (pointer)local_278;
      goto LAB_001482f0;
    }
    __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start;
    __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)__src;
    if (__n != 0) {
      memmove(pcVar12,__src,__n);
    }
    pcVar12[uVar37] = '\0';
    local_118 = (pointer)(pcVar12 + uVar37 + 1);
    local_1b0 = (pointer)(pcVar12 + (sVar17 - 1));
    pcVar12[sVar17 - 1] = '\0';
    if ((pcVar12[4] != 'x') || ((pcVar12[5] != -100 && (pcVar12[5] != -0x26)))) {
      decode(this,pcVar12,uVar37);
    }
    local_100._M_allocated_capacity = 0;
    local_108 = 0;
    if ((int)((uint)(byte)pcVar12[uVar37 - 1] << 0x18) < 0) {
LAB_001463d1:
      pcVar12 = (char *)0x0;
    }
    else {
      uVar35 = (ulong)((uint)(byte)pcVar12[uVar37 - 4] | (uint)(byte)pcVar12[uVar37 - 2] << 0x10 |
                       (uint)(byte)pcVar12[uVar37 - 3] << 8 |
                      (uint)(byte)pcVar12[uVar37 - 1] << 0x18);
      if (uVar37 < uVar35) goto LAB_001463d1;
      local_100._M_allocated_capacity = (uVar37 - uVar35) + 4;
      buf = (vector<char,_std::allocator<char>_> *)(pcVar12 + (uVar37 - uVar35) + 4);
      pcVar12 = pcVar12 + 4;
      local_108 = uVar35;
    }
    if (pcVar12 == (char *)0x0) {
      auStack_1e0._8_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1e0 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1e0 + 8);
      puVar24 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_230._M_allocated_capacity = *puVar24;
        local_230._8_8_ = puVar20[3];
        local_278._56_8_ = &local_230;
      }
      else {
        local_230._M_allocated_capacity = *puVar24;
        local_278._56_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar20;
      }
      local_238 = puVar20[1];
      *puVar20 = puVar24;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      local_278._24_8_ = local_278 + 0x28;
      std::__cxx11::string::_M_construct((ulong)(local_278 + 0x18),'\x03');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_278._24_8_,3,0x115);
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._56_8_ != &local_230) {
        uVar23 = local_230._M_allocated_capacity;
      }
      if ((ulong)uVar23 < (ulong)(local_278._32_8_ + local_238)) {
        uVar37 = 0xf;
        if ((undefined1 *)local_278._24_8_ != local_278 + 0x28) {
          uVar37 = local_278._40_8_;
        }
        if (uVar37 < (ulong)(local_278._32_8_ + local_238)) goto LAB_001484b4;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)(local_278 + 0x18),0,(char *)0x0,local_278._56_8_);
      }
      else {
LAB_001484b4:
        puVar20 = (undefined8 *)std::__cxx11::string::_M_append(local_278 + 0x38,local_278._24_8_);
      }
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      psVar27 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar27) {
        local_220.field_2._M_allocated_capacity = *psVar27;
        local_220.field_2._8_8_ = puVar20[3];
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar27;
        local_220._M_dataplus._M_p = (pointer)*puVar20;
      }
      local_220._M_string_length = puVar20[1];
      *puVar20 = psVar27;
      puVar20[1] = 0;
      *(undefined1 *)psVar27 = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
      local_1f8._0_8_ = &local_1e8;
      pp_Var25 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var25) {
        local_1e8 = *pp_Var25;
        auStack_1e0._0_8_ = puVar20[3];
      }
      else {
        local_1e8 = *pp_Var25;
        local_1f8._0_8_ = (_func_int **)*puVar20;
      }
      local_1f8._8_8_ = puVar20[1];
      *puVar20 = pp_Var25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append(local_1f8);
      local_288._0_8_ = local_278;
      pbVar41 = (pointer)(plVar19 + 2);
      if ((pointer)*plVar19 == pbVar41) {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_278._8_8_ = plVar19[3];
      }
      else {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_288._0_8_ = (pointer)*plVar19;
      }
      local_288._8_8_ = plVar19[1];
      *plVar19 = (long)pbVar41;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_288);
      local_2a8._0_8_ = local_2a8 + 0x10;
      ppcVar26 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar26) {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._24_8_ = puVar20[3];
      }
      else {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._0_8_ = (char **)*puVar20;
      }
      local_2a8._8_8_ = puVar20[1];
      *puVar20 = ppcVar26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_2a8);
      psVar27 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar27) {
        local_160._16_8_ = *psVar27;
        local_160._24_8_ = puVar20[3];
        local_160._0_8_ = local_160 + 0x10;
      }
      else {
        local_160._16_8_ = *psVar27;
        local_160._0_8_ = (size_type *)*puVar20;
      }
      local_160._8_8_ = puVar20[1];
      *puVar20 = psVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar22 = (BRDPoint *)std::__cxx11::string::append(local_160);
      BVar28 = (BRDPoint)(pBVar22 + 2);
      if (*pBVar22 == BVar28) {
        local_1a8._16_8_ = *(undefined8 *)BVar28;
        auStack_190._0_8_ = pBVar22[3];
        local_1a8._0_8_ = (long)local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *(undefined8 *)BVar28;
        local_1a8._0_8_ = *pBVar22;
      }
      local_1a8._8_8_ = pBVar22[1];
      *pBVar22 = BVar28;
      pBVar22[1].x = 0;
      pBVar22[1].y = 0;
      *(undefined1 *)&pBVar22[2].x = 0;
      psVar32 = &(local_1b8->super_BRDFileBase).error_msg;
      std::__cxx11::string::operator=((string *)psVar32,(string *)local_1a8);
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
        operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
      }
      if ((pointer)local_288._0_8_ != (pointer)local_278) {
        operator_delete((void *)local_288._0_8_,(ulong)(local_278._0_8_ + 1));
      }
      if ((_func_int **)local_1f8._0_8_ != &local_1e8) {
        operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_278._24_8_ != local_278 + 0x28) {
        operator_delete((void *)local_278._24_8_,local_278._40_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._56_8_ != &local_230) goto LAB_0014836b;
      goto LAB_00148378;
    }
    if (local_100._M_allocated_capacity == 0) {
      auStack_1e0._8_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1e0 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1e0 + 8);
      puVar24 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_230._M_allocated_capacity = *puVar24;
        local_230._8_8_ = puVar20[3];
        local_278._56_8_ = &local_230;
      }
      else {
        local_230._M_allocated_capacity = *puVar24;
        local_278._56_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar20;
      }
      local_238 = puVar20[1];
      *puVar20 = puVar24;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      local_278._24_8_ = local_278 + 0x28;
      std::__cxx11::string::_M_construct((ulong)(local_278 + 0x18),'\x03');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_278._24_8_,3,0x116);
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._56_8_ != &local_230) {
        uVar23 = local_230._M_allocated_capacity;
      }
      if ((ulong)uVar23 < (ulong)(local_278._32_8_ + local_238)) {
        uVar37 = 0xf;
        if ((undefined1 *)local_278._24_8_ != local_278 + 0x28) {
          uVar37 = local_278._40_8_;
        }
        if (uVar37 < (ulong)(local_278._32_8_ + local_238)) goto LAB_001488f4;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)(local_278 + 0x18),0,(char *)0x0,local_278._56_8_);
      }
      else {
LAB_001488f4:
        puVar20 = (undefined8 *)std::__cxx11::string::_M_append(local_278 + 0x38,local_278._24_8_);
      }
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      psVar27 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar27) {
        local_220.field_2._M_allocated_capacity = *psVar27;
        local_220.field_2._8_8_ = puVar20[3];
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar27;
        local_220._M_dataplus._M_p = (pointer)*puVar20;
      }
      local_220._M_string_length = puVar20[1];
      *puVar20 = psVar27;
      puVar20[1] = 0;
      *(undefined1 *)psVar27 = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
      local_1f8._0_8_ = &local_1e8;
      pp_Var25 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var25) {
        local_1e8 = *pp_Var25;
        auStack_1e0._0_8_ = puVar20[3];
      }
      else {
        local_1e8 = *pp_Var25;
        local_1f8._0_8_ = (_func_int **)*puVar20;
      }
      local_1f8._8_8_ = puVar20[1];
      *puVar20 = pp_Var25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append(local_1f8);
      local_288._0_8_ = local_278;
      pbVar41 = (pointer)(plVar19 + 2);
      if ((pointer)*plVar19 == pbVar41) {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_278._8_8_ = plVar19[3];
      }
      else {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_288._0_8_ = (pointer)*plVar19;
      }
      local_288._8_8_ = plVar19[1];
      *plVar19 = (long)pbVar41;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_288);
      local_2a8._0_8_ = local_2a8 + 0x10;
      ppcVar26 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar26) {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._24_8_ = puVar20[3];
      }
      else {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._0_8_ = (char **)*puVar20;
      }
      local_2a8._8_8_ = puVar20[1];
      *puVar20 = ppcVar26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_2a8);
      psVar27 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar27) {
        local_160._16_8_ = *psVar27;
        local_160._24_8_ = puVar20[3];
        local_160._0_8_ = local_160 + 0x10;
      }
      else {
        local_160._16_8_ = *psVar27;
        local_160._0_8_ = (size_type *)*puVar20;
      }
      local_160._8_8_ = puVar20[1];
      *puVar20 = psVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar22 = (BRDPoint *)std::__cxx11::string::append(local_160);
      BVar28 = (BRDPoint)(pBVar22 + 2);
      if (*pBVar22 == BVar28) {
        local_1a8._16_8_ = *(undefined8 *)BVar28;
        auStack_190._0_8_ = pBVar22[3];
        local_1a8._0_8_ = (long)local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *(undefined8 *)BVar28;
        local_1a8._0_8_ = *pBVar22;
      }
      local_1a8._8_8_ = pBVar22[1];
      *pBVar22 = BVar28;
      pBVar22[1].x = 0;
      pBVar22[1].y = 0;
      *(undefined1 *)&pBVar22[2].x = 0;
      psVar32 = &(local_1b8->super_BRDFileBase).error_msg;
      std::__cxx11::string::operator=((string *)psVar32,(string *)local_1a8);
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) goto LAB_0014687f;
      goto LAB_0014688c;
    }
    buffer = (vector<char,_std::allocator<char>_> *)
             decompress(pcVar12,local_100._M_allocated_capacity,&local_100._M_allocated_capacity);
    uVar23 = local_100._M_allocated_capacity;
    if (buffer == (vector<char,_std::allocator<char>_> *)0x0) {
      auStack_1e0._8_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1e0 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1e0 + 8);
      puVar24 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_230._M_allocated_capacity = *puVar24;
        local_230._8_8_ = puVar20[3];
        local_278._56_8_ = &local_230;
      }
      else {
        local_230._M_allocated_capacity = *puVar24;
        local_278._56_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar20;
      }
      local_238 = puVar20[1];
      *puVar20 = puVar24;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      local_278._24_8_ = local_278 + 0x28;
      std::__cxx11::string::_M_construct((ulong)(local_278 + 0x18),'\x03');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_278._24_8_,3,0x118);
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._56_8_ != &local_230) {
        uVar23 = local_230._M_allocated_capacity;
      }
      if ((ulong)uVar23 < (ulong)(local_278._32_8_ + local_238)) {
        uVar37 = 0xf;
        if ((undefined1 *)local_278._24_8_ != local_278 + 0x28) {
          uVar37 = local_278._40_8_;
        }
        if (uVar37 < (ulong)(local_278._32_8_ + local_238)) goto LAB_00148ca1;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)(local_278 + 0x18),0,(char *)0x0,local_278._56_8_);
      }
      else {
LAB_00148ca1:
        puVar20 = (undefined8 *)std::__cxx11::string::_M_append(local_278 + 0x38,local_278._24_8_);
      }
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      psVar27 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar27) {
        local_220.field_2._M_allocated_capacity = *psVar27;
        local_220.field_2._8_8_ = puVar20[3];
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar27;
        local_220._M_dataplus._M_p = (pointer)*puVar20;
      }
      local_220._M_string_length = puVar20[1];
      *puVar20 = psVar27;
      puVar20[1] = 0;
      *(undefined1 *)psVar27 = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
      local_1f8._0_8_ = &local_1e8;
      pp_Var25 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var25) {
        local_1e8 = *pp_Var25;
        auStack_1e0._0_8_ = puVar20[3];
      }
      else {
        local_1e8 = *pp_Var25;
        local_1f8._0_8_ = (_func_int **)*puVar20;
      }
      local_1f8._8_8_ = puVar20[1];
      *puVar20 = pp_Var25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append(local_1f8);
      local_288._0_8_ = local_278;
      pbVar41 = (pointer)(plVar19 + 2);
      if ((pointer)*plVar19 == pbVar41) {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_278._8_8_ = plVar19[3];
      }
      else {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_288._0_8_ = (pointer)*plVar19;
      }
      local_288._8_8_ = plVar19[1];
      *plVar19 = (long)pbVar41;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_288);
      local_2a8._0_8_ = local_2a8 + 0x10;
      ppcVar26 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar26) {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._24_8_ = puVar20[3];
      }
      else {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._0_8_ = (char **)*puVar20;
      }
      local_2a8._8_8_ = puVar20[1];
      *puVar20 = ppcVar26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_2a8);
      local_160._0_8_ = local_160 + 0x10;
      psVar27 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar27) {
        local_160._16_8_ = *psVar27;
        local_160._24_8_ = puVar20[3];
      }
      else {
        local_160._16_8_ = *psVar27;
        local_160._0_8_ = (size_type *)*puVar20;
      }
      local_160._8_8_ = puVar20[1];
      *puVar20 = psVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar22 = (BRDPoint *)std::__cxx11::string::append(local_160);
      goto LAB_0014821d;
    }
    if (local_100._M_allocated_capacity == 0) {
      auStack_1e0._8_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1e0 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1e0 + 8);
      puVar24 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_230._M_allocated_capacity = *puVar24;
        local_230._8_8_ = puVar20[3];
        local_278._56_8_ = &local_230;
      }
      else {
        local_230._M_allocated_capacity = *puVar24;
        local_278._56_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar20;
      }
      local_238 = puVar20[1];
      *puVar20 = puVar24;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      local_278._24_8_ = local_278 + 0x28;
      std::__cxx11::string::_M_construct((ulong)(local_278 + 0x18),'\x03');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_278._24_8_,3,0x119);
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._56_8_ != &local_230) {
        uVar23 = local_230._M_allocated_capacity;
      }
      if ((ulong)uVar23 < (ulong)(local_278._32_8_ + local_238)) {
        uVar37 = 0xf;
        if ((undefined1 *)local_278._24_8_ != local_278 + 0x28) {
          uVar37 = local_278._40_8_;
        }
        if (uVar37 < (ulong)(local_278._32_8_ + local_238)) goto LAB_00148f90;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)(local_278 + 0x18),0,(char *)0x0,local_278._56_8_);
      }
      else {
LAB_00148f90:
        puVar20 = (undefined8 *)std::__cxx11::string::_M_append(local_278 + 0x38,local_278._24_8_);
      }
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      psVar27 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar27) {
        local_220.field_2._M_allocated_capacity = *psVar27;
        local_220.field_2._8_8_ = puVar20[3];
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar27;
        local_220._M_dataplus._M_p = (pointer)*puVar20;
      }
      local_220._M_string_length = puVar20[1];
      *puVar20 = psVar27;
      puVar20[1] = 0;
      *(undefined1 *)psVar27 = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
      local_1f8._0_8_ = &local_1e8;
      pp_Var25 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var25) {
        local_1e8 = *pp_Var25;
        auStack_1e0._0_8_ = puVar20[3];
      }
      else {
        local_1e8 = *pp_Var25;
        local_1f8._0_8_ = (_func_int **)*puVar20;
      }
      local_1f8._8_8_ = puVar20[1];
      *puVar20 = pp_Var25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append(local_1f8);
      local_288._0_8_ = local_278;
      pbVar41 = (pointer)(plVar19 + 2);
      if ((pointer)*plVar19 == pbVar41) {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_278._8_8_ = plVar19[3];
      }
      else {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_288._0_8_ = (pointer)*plVar19;
      }
      local_288._8_8_ = plVar19[1];
      *plVar19 = (long)pbVar41;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_288);
      ppcVar26 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar26) {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._24_8_ = puVar20[3];
        local_2a8._0_8_ = local_2a8 + 0x10;
      }
      else {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._0_8_ = (char **)*puVar20;
      }
      local_2a8._8_8_ = puVar20[1];
      *puVar20 = ppcVar26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_2a8);
      psVar27 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar27) {
        local_160._16_8_ = *psVar27;
        local_160._24_8_ = puVar20[3];
        local_160._0_8_ = local_160 + 0x10;
      }
      else {
        local_160._16_8_ = *psVar27;
        local_160._0_8_ = (size_type *)*puVar20;
      }
      local_160._8_8_ = puVar20[1];
      *puVar20 = psVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar22 = (BRDPoint *)std::__cxx11::string::append(local_160);
      BVar28 = (BRDPoint)(pBVar22 + 2);
      if (*pBVar22 == BVar28) {
        local_1a8._16_8_ = *(undefined8 *)BVar28;
        auStack_190._0_8_ = pBVar22[3];
        local_1a8._0_8_ = (long)local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *(undefined8 *)BVar28;
        local_1a8._0_8_ = *pBVar22;
      }
      local_1a8._8_8_ = pBVar22[1];
      *pBVar22 = BVar28;
      pBVar22[1].x = 0;
      pBVar22[1].y = 0;
      *(undefined1 *)&pBVar22[2].x = 0;
      psVar32 = &(local_1b8->super_BRDFileBase).error_msg;
      std::__cxx11::string::operator=((string *)psVar32,(string *)local_1a8);
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      bVar10 = (undefined1 *)local_2a8._0_8_ == local_2a8 + 0x10;
      goto LAB_00146878;
    }
    if (buffer == buf) {
      auStack_1e0._8_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1e0 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1e0 + 8);
      local_278._56_8_ = &local_230;
      puVar24 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_230._M_allocated_capacity = *puVar24;
        local_230._8_8_ = puVar20[3];
      }
      else {
        local_230._M_allocated_capacity = *puVar24;
        local_278._56_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar20;
      }
      local_238 = puVar20[1];
      *puVar20 = puVar24;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      std::__cxx11::to_string((string *)(local_278 + 0x18),0x11b);
      std::operator+(&local_220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_278 + 0x38),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_278 + 0x18));
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
      local_1f8._0_8_ = &local_1e8;
      pp_Var25 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var25) {
        local_1e8 = *pp_Var25;
        auStack_1e0._0_8_ = puVar20[3];
      }
      else {
        local_1e8 = *pp_Var25;
        local_1f8._0_8_ = (_func_int **)*puVar20;
      }
      local_1f8._8_8_ = puVar20[1];
      *puVar20 = pp_Var25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append(local_1f8);
      local_288._0_8_ = local_278;
      pbVar41 = (pointer)(plVar19 + 2);
      if ((pointer)*plVar19 == pbVar41) {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_278._8_8_ = plVar19[3];
      }
      else {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_288._0_8_ = (pointer)*plVar19;
      }
      local_288._8_8_ = plVar19[1];
      *plVar19 = (long)pbVar41;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_288);
      local_2a8._0_8_ = local_2a8 + 0x10;
      ppcVar26 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar26) {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._24_8_ = puVar20[3];
      }
      else {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._0_8_ = (char **)*puVar20;
      }
      local_2a8._8_8_ = puVar20[1];
      *puVar20 = ppcVar26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_2a8);
      local_160._0_8_ = local_160 + 0x10;
      psVar27 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar27) {
        local_160._16_8_ = *psVar27;
        local_160._24_8_ = puVar20[3];
      }
      else {
        local_160._16_8_ = *psVar27;
        local_160._0_8_ = (size_type *)*puVar20;
      }
      local_160._8_8_ = puVar20[1];
      *puVar20 = psVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar22 = (BRDPoint *)std::__cxx11::string::append(local_160);
    }
    else if (local_108 == 0) {
      auStack_1e0._8_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1e0 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1e0 + 8);
      local_278._56_8_ = &local_230;
      puVar24 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_230._M_allocated_capacity = *puVar24;
        local_230._8_8_ = puVar20[3];
      }
      else {
        local_230._M_allocated_capacity = *puVar24;
        local_278._56_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar20;
      }
      local_238 = puVar20[1];
      *puVar20 = puVar24;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      std::__cxx11::to_string((string *)(local_278 + 0x18),0x11c);
      std::operator+(&local_220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_278 + 0x38),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_278 + 0x18));
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
      local_1f8._0_8_ = &local_1e8;
      pp_Var25 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var25) {
        local_1e8 = *pp_Var25;
        auStack_1e0._0_8_ = puVar20[3];
      }
      else {
        local_1e8 = *pp_Var25;
        local_1f8._0_8_ = (_func_int **)*puVar20;
      }
      local_1f8._8_8_ = puVar20[1];
      *puVar20 = pp_Var25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append(local_1f8);
      local_288._0_8_ = local_278;
      pbVar41 = (pointer)(plVar19 + 2);
      if ((pointer)*plVar19 == pbVar41) {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_278._8_8_ = plVar19[3];
      }
      else {
        local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
        local_288._0_8_ = (pointer)*plVar19;
      }
      local_288._8_8_ = plVar19[1];
      *plVar19 = (long)pbVar41;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_288);
      local_2a8._0_8_ = local_2a8 + 0x10;
      ppcVar26 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar26) {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._24_8_ = puVar20[3];
      }
      else {
        local_2a8._16_8_ = *ppcVar26;
        local_2a8._0_8_ = (char **)*puVar20;
      }
      local_2a8._8_8_ = puVar20[1];
      *puVar20 = ppcVar26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_2a8);
      local_160._0_8_ = local_160 + 0x10;
      psVar27 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar27) {
        local_160._16_8_ = *psVar27;
        local_160._24_8_ = puVar20[3];
      }
      else {
        local_160._16_8_ = *psVar27;
        local_160._0_8_ = (size_type *)*puVar20;
      }
      local_160._8_8_ = puVar20[1];
      *puVar20 = psVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar22 = (BRDPoint *)std::__cxx11::string::append(local_160);
    }
    else {
      pcVar12 = decompress((char *)buf,local_108,&local_108);
      if (pcVar12 == (char *)0x0) {
        auStack_1e0._8_8_ = &local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(auStack_1e0 + 8),
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                   ,"");
        puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1e0 + 8);
        local_278._56_8_ = &local_230;
        puVar24 = puVar20 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar20 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_230._M_allocated_capacity = *puVar24;
          local_230._8_8_ = puVar20[3];
        }
        else {
          local_230._M_allocated_capacity = *puVar24;
          local_278._56_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar20;
        }
        local_238 = puVar20[1];
        *puVar20 = puVar24;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        std::__cxx11::to_string((string *)(local_278 + 0x18),0x11e);
        std::operator+(&local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_278 + 0x38),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_278 + 0x18));
        puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
        local_1f8._0_8_ = &local_1e8;
        pp_Var25 = (_func_int **)(puVar20 + 2);
        if ((_func_int **)*puVar20 == pp_Var25) {
          local_1e8 = *pp_Var25;
          auStack_1e0._0_8_ = puVar20[3];
        }
        else {
          local_1e8 = *pp_Var25;
          local_1f8._0_8_ = (_func_int **)*puVar20;
        }
        local_1f8._8_8_ = puVar20[1];
        *puVar20 = pp_Var25;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append(local_1f8);
        local_288._0_8_ = local_278;
        pbVar41 = (pointer)(plVar19 + 2);
        if ((pointer)*plVar19 == pbVar41) {
          local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
          local_278._8_8_ = plVar19[3];
        }
        else {
          local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
          local_288._0_8_ = (pointer)*plVar19;
        }
        local_288._8_8_ = plVar19[1];
        *plVar19 = (long)pbVar41;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        puVar20 = (undefined8 *)std::__cxx11::string::append(local_288);
        local_2a8._0_8_ = local_2a8 + 0x10;
        ppcVar26 = (char **)(puVar20 + 2);
        if ((char **)*puVar20 == ppcVar26) {
          local_2a8._16_8_ = *ppcVar26;
          local_2a8._24_8_ = puVar20[3];
        }
        else {
          local_2a8._16_8_ = *ppcVar26;
          local_2a8._0_8_ = (char **)*puVar20;
        }
        local_2a8._8_8_ = puVar20[1];
        *puVar20 = ppcVar26;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        puVar20 = (undefined8 *)std::__cxx11::string::append(local_2a8);
        local_160._0_8_ = local_160 + 0x10;
        psVar27 = puVar20 + 2;
        if ((size_type *)*puVar20 == psVar27) {
          local_160._16_8_ = *psVar27;
          local_160._24_8_ = puVar20[3];
        }
        else {
          local_160._16_8_ = *psVar27;
          local_160._0_8_ = (size_type *)*puVar20;
        }
        local_160._8_8_ = puVar20[1];
        *puVar20 = psVar27;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        pBVar22 = (BRDPoint *)std::__cxx11::string::append(local_160);
      }
      else {
        if (local_108 != 0) {
          local_160._0_8_ = &pFStack_130;
          local_160._8_8_ = 1;
          local_160._16_8_ = 0;
          local_160._24_8_ = 0;
          local_140 = 1.0;
          local_138 = (pointer)0x0;
          pFStack_130 = (pointer)0x0;
          local_98.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          stringfile((char *)buffer,&local_98);
          local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          stringfile(pcVar12,&local_d8);
          sVar13 = 0;
          do {
            if (*(char *)((long)&(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start + sVar13) == ',') {
              *(char *)((long)&(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start + sVar13) = '.';
            }
            sVar13 = sVar13 + 1;
          } while (uVar23 != sVar13);
          local_128 = (pointer)0x0;
          if (local_98.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_98.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_78 = (vector<BRDNail,std::allocator<BRDNail>> *)
                       &(local_1b8->super_BRDFileBase).nails;
            local_80 = (vector<BRDPin,std::allocator<BRDPin>> *)&(local_1b8->super_BRDFileBase).pins
            ;
            local_70 = &(local_1b8->super_BRDFileBase).parts;
            local_128 = (pointer)0x3f800000;
            uVar31 = 0;
            local_68 = local_98.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            ppcVar34 = local_98.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            ppcVar42 = local_98.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            do {
              local_120 = (pointer)CONCAT44(local_120._4_4_,uVar31);
              pBVar39 = (pointer)(*ppcVar42 + -1);
              do {
                pBVar38 = pBVar39;
                bVar3 = *(byte *)((long)&pBVar38->name + 1);
                pBVar39 = (pointer)((long)&pBVar38->name + 1);
                iVar11 = isspace((uint)bVar3);
                pBVar14 = (pointer)CONCAT44(extraout_var,iVar11);
              } while (iVar11 != 0);
              if (bVar3 == 0) {
                uVar31 = (uint)local_120;
              }
              else {
                local_288._0_8_ = pBVar39;
                iVar11 = strcmp((char *)pBVar39,"UNIT:millimeters");
                local_110 = (string *)CONCAT44(local_110._4_4_,0x41cb3333);
                if (iVar11 != 0) {
                  local_110 = (string *)CONCAT44(local_110._4_4_,local_128._0_4_);
                }
                uVar31 = (uint)local_120;
                if (*(char *)&pBVar39->name == 'S') {
                  local_288._0_8_ = (long)&pBVar38->name + 3;
                  if ((uint)local_120 == 3) {
                    local_288._0_8_ = (long)&pBVar38->name + 5;
                    local_2a8._0_8_ = (char **)0x0;
                    local_2a8._8_8_ = (FZFile *)0x0;
                    local_2a8._16_8_ = "UNCONNECTED";
                    local_1a8._0_8_ = local_288;
                    local_1a8._8_8_ = (pointer)local_1f8;
                    local_1a8._16_8_ = &local_118;
                    auStack_190._0_8_ = &local_1b0;
                    local_2a8._16_8_ =
                         parse::anon_class_32_4_fa413470::operator()
                                   ((anon_class_32_4_fa413470 *)local_1a8);
                    local_1a8._0_8_ = local_288;
                    local_1a8._8_8_ = (pointer)local_1f8;
                    local_1a8._16_8_ = &local_118;
                    auStack_190._0_8_ = &local_1b0;
                    parse::anon_class_32_4_fa413470::operator()
                              ((anon_class_32_4_fa413470 *)local_1a8);
                    strtol((char *)local_288._0_8_,(char **)local_288,10);
                    ppcVar34 = local_68;
                    if (*(char *)(char **)local_288._0_8_ == '!') {
                      local_288._0_8_ = (long)(char **)local_288._0_8_ + 1;
                    }
                    local_1a8._16_8_ = &local_118;
                    auStack_190._0_8_ = &local_1b0;
                    local_1a8._0_8_ = local_288;
                    local_1a8._8_8_ = (pointer)local_1f8;
                    parse::anon_class_32_4_fa413470::operator()
                              ((anon_class_32_4_fa413470 *)local_1a8);
                    dVar8 = strtod((char *)local_288._0_8_,(char **)local_288);
                    if (*(char *)(char **)local_288._0_8_ == '!') {
                      local_288._0_8_ = (long)(char **)local_288._0_8_ + 1;
                    }
                    local_128 = (pointer)(double)local_110._0_4_;
                    local_2a8._4_4_ = (int)(dVar8 * (double)local_128);
                    dVar8 = strtod((char *)local_288._0_8_,(char **)local_288);
                    if (*(char *)(char **)local_288._0_8_ == '!') {
                      local_288._0_8_ = (long)(char **)local_288._0_8_ + 1;
                    }
                    local_2a8._8_4_ = (int)(dVar8 * (double)local_128);
                    local_1a8._16_8_ = &local_118;
                    auStack_190._0_8_ = &local_1b0;
                    local_1a8._0_8_ = local_288;
                    local_1a8._8_8_ = (pointer)local_1f8;
                    pcVar12 = parse::anon_class_32_4_fa413470::operator()
                                        ((anon_class_32_4_fa413470 *)local_1a8);
                    iVar11 = strcmp(pcVar12,"T");
                    if (iVar11 == 0) {
                      local_2a8._12_4_ = 2;
                    }
                    else {
                      local_2a8._12_4_ = 1;
                    }
                    strtod((char *)local_288._0_8_,(char **)local_288);
                    if (*(char *)(char **)local_288._0_8_ == '!') {
                      local_288._0_8_ = (long)(char **)local_288._0_8_ + 1;
                    }
                    __position._M_current =
                         (local_1b8->super_BRDFileBase).nails.
                         super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    uVar31 = (uint)local_120;
                    if (__position._M_current ==
                        (local_1b8->super_BRDFileBase).nails.
                        super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<BRDNail,std::allocator<BRDNail>>::
                      _M_realloc_insert<BRDNail_const&>(local_78,__position,(BRDNail *)local_2a8);
                      pBVar14 = extraout_RAX_00;
                    }
                    else {
                      (__position._M_current)->net = (char *)local_2a8._16_8_;
                      (__position._M_current)->probe = local_2a8._0_4_;
                      ((__position._M_current)->pos).x = local_2a8._4_4_;
                      *(undefined8 *)&((__position._M_current)->pos).y = local_2a8._8_8_;
                      ppBVar2 = &(local_1b8->super_BRDFileBase).nails.
                                 super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
                      *ppBVar2 = *ppBVar2 + 1;
                      pBVar14 = (pointer)local_2a8._16_8_;
                    }
                  }
                  else if ((uint)local_120 == 2) {
                    local_1a8._0_4_ = 0;
                    local_1a8._4_4_ = 0;
                    local_1a8._8_8_ = (pointer)0x0;
                    local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffff00000000;
                    auStack_190._0_8_ = "UNCONNECTED";
                    auStack_190._8_8_ = (pointer)0x3fe0000000000000;
                    auStack_190._16_8_ = (pointer)0x0;
                    auStack_190._24_4_ = 0;
                    auStack_190._28_4_ = 0;
                    local_2a8._24_8_ = &local_1b0;
                    local_2a8._0_8_ = local_288;
                    local_2a8._8_8_ = (FZFile *)local_1f8;
                    local_2a8._16_8_ = &local_118;
                    auStack_190._0_8_ =
                         parse::anon_class_32_4_fa413470::operator()
                                   ((anon_class_32_4_fa413470 *)local_2a8);
                    local_2a8._24_8_ = &local_1b0;
                    local_2a8._0_8_ = local_288;
                    local_2a8._8_8_ = (FZFile *)local_1f8;
                    local_2a8._16_8_ = &local_118;
                    pcVar12 = parse::anon_class_32_4_fa413470::operator()
                                        ((anon_class_32_4_fa413470 *)local_2a8);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_2a8,pcVar12,(allocator<char> *)&local_220);
                    puVar16 = (uint *)std::
                                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                            *)local_160,(key_type *)local_2a8);
                    local_1a8._12_4_ = *puVar16;
                    if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
                      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
                    }
                    local_2a8._24_8_ = &local_1b0;
                    local_2a8._0_8_ = local_288;
                    local_2a8._8_8_ = (FZFile *)local_1f8;
                    local_2a8._16_8_ = &local_118;
                    auStack_190._16_8_ =
                         parse::anon_class_32_4_fa413470::operator()
                                   ((anon_class_32_4_fa413470 *)local_2a8);
                    local_2a8._24_8_ = &local_1b0;
                    local_2a8._0_8_ = local_288;
                    local_2a8._8_8_ = (FZFile *)local_1f8;
                    local_2a8._16_8_ = &local_118;
                    pcVar12 = parse::anon_class_32_4_fa413470::operator()
                                        ((anon_class_32_4_fa413470 *)local_2a8);
                    uVar23 = auStack_190._16_8_;
                    sVar17 = strlen((char *)auStack_190._16_8_);
                    if ((sVar17 < 2) &&
                       ((*(char *)(char **)uVar23 == '0' || (*(char *)(char **)uVar23 == '\0')))) {
                      auStack_190._24_4_ = SUB84(pcVar12,0);
                      auStack_190._28_4_ = (undefined4)((ulong)pcVar12 >> 0x20);
                    }
                    dVar8 = strtod((char *)local_288._0_8_,(char **)local_288);
                    if (*(char *)(char **)local_288._0_8_ == '!') {
                      local_288._0_8_ = (long)(char **)local_288._0_8_ + 1;
                    }
                    local_128 = (pointer)(double)local_110._0_4_;
                    local_1a8._0_4_ = (int)(dVar8 * (double)local_128);
                    dVar8 = strtod((char *)local_288._0_8_,(char **)local_288);
                    if (*(char *)(char **)local_288._0_8_ == '!') {
                      local_288._0_8_ = (long)(char **)local_288._0_8_ + 1;
                    }
                    local_1a8._4_4_ = (int)(dVar8 * (double)local_128);
                    local_2a8._8_8_ = local_1b8;
                    local_2a8._0_8_ = local_288;
                    local_1a8._8_4_ =
                         parse::anon_class_16_2_d7082a65::operator()
                                   ((anon_class_16_2_d7082a65 *)local_2a8);
                    dVar8 = strtod((char *)local_288._0_8_,(char **)local_288);
                    if (*(char *)(char **)local_288._0_8_ == '!') {
                      local_288._0_8_ = (long)(char **)local_288._0_8_ + 1;
                    }
                    dVar9 = 0.5;
                    if (0.5 <= dVar8 / 100.0) {
                      dVar9 = dVar8 / 100.0;
                    }
                    auStack_190._8_8_ = dVar9 * (double)local_128;
                    BVar4 = (local_1b8->super_BRDFileBase).parts.
                            super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                            super__Vector_impl_data._M_start[local_1a8._12_4_ - 1].mounting_side;
                    uVar31 = (uint)local_120;
                    if (BVar4 == Both) {
                      local_1a8._16_8_ = (ulong)(uint)local_1a8._20_4_ << 0x20;
                    }
                    else if (BVar4 == Bottom) {
                      local_1a8._16_4_ = 1;
                    }
                    else if (BVar4 == Top) {
                      local_1a8._16_4_ = 2;
                    }
                    __position_00._M_current =
                         (local_1b8->super_BRDFileBase).pins.
                         super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (__position_00._M_current ==
                        (local_1b8->super_BRDFileBase).pins.
                        super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<BRDPin,std::allocator<BRDPin>>::_M_realloc_insert<BRDPin_const&>
                                (local_80,__position_00,(BRDPin *)local_1a8);
                      pBVar14 = extraout_RAX_01;
                    }
                    else {
                      (__position_00._M_current)->name =
                           (char *)CONCAT44(auStack_190._28_4_,auStack_190._24_4_);
                      (__position_00._M_current)->radius = (double)auStack_190._8_8_;
                      (__position_00._M_current)->snum = (char *)auStack_190._16_8_;
                      *(undefined8 *)&(__position_00._M_current)->side = local_1a8._16_8_;
                      (__position_00._M_current)->net = (char *)auStack_190._0_8_;
                      ((__position_00._M_current)->pos).x = local_1a8._0_4_;
                      ((__position_00._M_current)->pos).y = local_1a8._4_4_;
                      (__position_00._M_current)->probe = local_1a8._8_4_;
                      (__position_00._M_current)->part = local_1a8._12_4_;
                      ppBVar1 = &(local_1b8->super_BRDFileBase).pins.
                                 super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
                      *ppBVar1 = *ppBVar1 + 1;
                      pBVar14 = (pointer)CONCAT44(auStack_190._28_4_,auStack_190._24_4_);
                    }
                  }
                  else {
                    pBVar14 = (pointer)local_288._0_8_;
                    if ((uint)local_120 == 1) {
                      local_1a8._0_4_ = 0;
                      local_1a8._4_4_ = 0;
                      local_1a8._8_8_ = auStack_190;
                      local_1a8._16_8_ = (pointer *)0x0;
                      auStack_190._0_8_ = auStack_190._0_8_ & 0xffffffffffffff00;
                      auStack_190._32_4_ = 0;
                      BStack_16c.x = 0;
                      BStack_16c.y = 0;
                      auStack_190._16_8_ = (pointer)0x0;
                      auStack_190._24_4_ = 0;
                      auStack_190._28_4_ = 0;
                      local_2a8._24_8_ = &local_1b0;
                      local_2a8._0_8_ = local_288;
                      local_2a8._8_8_ = (FZFile *)local_1f8;
                      local_2a8._16_8_ = &local_118;
                      local_1a8._0_8_ =
                           parse::anon_class_32_4_fa413470::operator()
                                     ((anon_class_32_4_fa413470 *)local_2a8);
                      local_2a8._24_8_ = &local_1b0;
                      local_2a8._0_8_ = local_288;
                      local_2a8._8_8_ = (FZFile *)local_1f8;
                      local_2a8._16_8_ = &local_118;
                      parse::anon_class_32_4_fa413470::operator()
                                ((anon_class_32_4_fa413470 *)local_2a8);
                      local_2a8._24_8_ = &local_1b0;
                      local_2a8._0_8_ = local_288;
                      local_2a8._8_8_ = (FZFile *)local_1f8;
                      local_2a8._16_8_ = &local_118;
                      parse::anon_class_32_4_fa413470::operator()
                                ((anon_class_32_4_fa413470 *)local_2a8);
                      local_2a8._24_8_ = &local_1b0;
                      local_2a8._0_8_ = local_288;
                      local_2a8._8_8_ = (FZFile *)local_1f8;
                      local_2a8._16_8_ = &local_118;
                      pcVar12 = parse::anon_class_32_4_fa413470::operator()
                                          ((anon_class_32_4_fa413470 *)local_2a8);
                      local_2a8._24_8_ = &local_1b0;
                      local_2a8._0_8_ = local_288;
                      local_2a8._8_8_ = (FZFile *)local_1f8;
                      local_2a8._16_8_ = &local_118;
                      parse::anon_class_32_4_fa413470::operator()
                                ((anon_class_32_4_fa413470 *)local_2a8);
                      auStack_190._16_8_ = auStack_190._16_8_ & 0xffffffff;
                      iVar11 = strcmp(pcVar12,"YES");
                      auStack_190._16_4_ = (iVar11 == 0) + 1;
                      auStack_190._24_4_ = 0;
                      std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                (local_70,(value_type *)local_1a8);
                      pBVar39 = (local_1b8->super_BRDFileBase).parts.
                                super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                super__Vector_impl_data._M_finish;
                      pBVar14 = (local_1b8->super_BRDFileBase).parts.
                                super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_2a8,(char *)local_1a8._0_8_,
                                 (allocator<char> *)&local_220);
                      pmVar15 = std::__detail::
                                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)local_160,(key_type *)local_2a8);
                      *pmVar15 = (int)((ulong)((long)pBVar39 - (long)pBVar14) >> 3) * 0x38e38e39;
                      if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
                        operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
                      }
                      uVar31 = (uint)local_120;
                      pBVar14 = (pointer)auStack_190;
                      if ((pointer)local_1a8._8_8_ != (pointer)auStack_190) {
                        operator_delete((void *)local_1a8._8_8_,(ulong)(auStack_190._0_8_ + 1));
                        pBVar14 = extraout_RAX;
                      }
                    }
                  }
                }
                else {
                  pBVar14 = (pointer)0x0;
                  if (*(char *)&pBVar39->name == 'A') {
                    pcVar12 = (char *)((long)&pBVar38->name + 3);
                    iVar11 = strncmp(pcVar12,"REFDES",6);
                    if (iVar11 == 0) {
                      pBVar14 = (pointer)CONCAT44(extraout_var_00,iVar11);
                      uVar31 = 1;
                    }
                    else {
                      iVar11 = strncmp(pcVar12,"NET_NAME",8);
                      if (iVar11 == 0) {
                        pBVar14 = (pointer)CONCAT44(extraout_var_01,iVar11);
                        uVar31 = 2;
                      }
                      else {
                        iVar11 = strncmp(pcVar12,"TESTVIA",7);
                        if (iVar11 == 0) {
                          pBVar14 = (pointer)CONCAT44(extraout_var_02,iVar11);
                          uVar31 = 3;
                        }
                        else {
                          iVar11 = strncmp(pcVar12,"GRAPHIC_DATA_NAME",0x11);
                          if (iVar11 == 0) {
                            pBVar14 = (pointer)CONCAT44(extraout_var_03,iVar11);
                            uVar31 = 4;
                          }
                          else {
                            iVar11 = strncmp(pcVar12,"CLASS",5);
                            if (iVar11 == 0) {
                              pBVar14 = (pointer)CONCAT44(extraout_var_04,iVar11);
                              uVar31 = 5;
                            }
                            else {
                              iVar11 = strncmp(pcVar12,"LOGOInfo",8);
                              if (iVar11 == 0) {
                                pBVar14 = (pointer)CONCAT44(extraout_var_05,iVar11);
                                uVar31 = 6;
                              }
                              else {
                                iVar11 = strncmp(pcVar12,"UnDrawSym",9);
                                pBVar14 = (pointer)(ulong)(uint)-iVar11;
                                uVar31 = -(uint)(iVar11 != 0) | 7;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                local_128 = (pointer)CONCAT44(local_128._4_4_,local_110._0_4_);
              }
              ppcVar42 = ppcVar42 + 1;
            } while (ppcVar42 != ppcVar34);
            local_128 = (pointer)CONCAT71((int7)((ulong)pBVar14 >> 8),uVar31 != 0);
          }
          if (0x10 < (ulong)((long)local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) {
            local_110 = (string *)&(local_1b8->super_BRDFileBase).error_msg;
            local_120 = (pointer)&local_1b8->partsDesc;
            uVar37 = 2;
            do {
              pbVar29 = (byte *)local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                                .super__Vector_impl_data._M_start[uVar37];
              pbVar40 = pbVar29 + -1;
              do {
                pbVar29 = pbVar29 + 1;
                bVar3 = pbVar40[1];
                pbVar40 = pbVar40 + 1;
                iVar11 = isspace((uint)bVar3);
              } while (iVar11 != 0);
              if ((bVar3 != 0) && (local_200 = pbVar40, bVar3 != 0x73)) {
                auStack_190._0_8_ = (char **)0x0;
                auStack_190._8_8_ = (FZFile *)0x0;
                auStack_190._16_8_ = (pointer)0x0;
                bVar3 = *pbVar40;
                if ((bVar3 != 0) && (iVar11 = isspace((uint)bVar3), bVar3 != 9)) {
                  while (iVar11 != 0) {
                    bVar3 = *pbVar29;
                    pbVar40 = pbVar29;
                    if ((bVar3 == 0) || (iVar11 = isspace((uint)bVar3), bVar3 == 9)) break;
                    pbVar29 = pbVar29 + 1;
                  }
                }
                local_200 = pbVar40;
                pbVar40 = local_200;
                for (; (*local_200 != 0 && (*local_200 != 9)); local_200 = local_200 + 1) {
                }
                *local_200 = 0;
                local_200 = local_200 + 1;
                local_1a8._0_8_ = fix_to_utf8((char *)pbVar40,(char **)&local_118,(char *)local_1b0)
                ;
                pbVar40 = local_200;
                bVar3 = *local_200;
                pbVar29 = pbVar40;
                if ((bVar3 != 0) && (iVar11 = isspace((uint)bVar3), bVar3 != 9)) {
                  while (pbVar29 = pbVar40, iVar11 != 0) {
                    pbVar40 = pbVar40 + 1;
                    bVar3 = *pbVar40;
                    pbVar29 = pbVar40;
                    if ((bVar3 == 0) || (iVar11 = isspace((uint)bVar3), bVar3 == 9)) break;
                  }
                }
                for (; (local_200 = pbVar29, pbVar29 = local_200, *pbVar40 != 0 && (*pbVar40 != 9));
                    pbVar40 = pbVar40 + 1) {
                }
                *pbVar40 = 0;
                local_200 = pbVar40 + 1;
                local_1a8._8_8_ = fix_to_utf8((char *)pbVar29,(char **)&local_118,(char *)local_1b0)
                ;
                lVar18 = strtol((char *)local_200,(char **)&local_200,10);
                if (*local_200 == 9) {
                  local_200 = local_200 + 1;
                }
                if ((int)lVar18 < 0) {
                  local_b8[0] = local_a8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_b8,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                             ,"");
                  plVar19 = (long *)std::__cxx11::string::append((char *)local_b8);
                  puVar24 = (ulong *)(plVar19 + 2);
                  if ((ulong *)*plVar19 == puVar24) {
                    local_278._40_8_ = *puVar24;
                    local_278._48_8_ = plVar19[3];
                    local_278._24_8_ = local_278 + 0x28;
                  }
                  else {
                    local_278._40_8_ = *puVar24;
                    local_278._24_8_ = (ulong *)*plVar19;
                  }
                  local_278._32_8_ = plVar19[1];
                  *plVar19 = (long)puVar24;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  local_100._8_8_ = local_e8;
                  std::__cxx11::string::_M_construct((long)&local_100 + 8,'\x03');
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_100._8_8_,3,0x1c2);
                  uVar35 = 0xf;
                  if ((undefined1 *)local_278._24_8_ != local_278 + 0x28) {
                    uVar35 = local_278._40_8_;
                  }
                  if (uVar35 < (ulong)(local_f0 + local_278._32_8_)) {
                    uVar35 = 0xf;
                    if ((ulong *)local_100._8_8_ != local_e8) {
                      uVar35 = local_e8[0];
                    }
                    if (uVar35 < (ulong)(local_f0 + local_278._32_8_)) goto LAB_001476c8;
                    plVar19 = (long *)std::__cxx11::string::replace
                                                ((long)&local_100 + 8,0,(char *)0x0,local_278._24_8_
                                                );
                  }
                  else {
LAB_001476c8:
                    plVar19 = (long *)std::__cxx11::string::_M_append
                                                (local_278 + 0x18,local_100._8_8_);
                  }
                  pBVar22 = (BRDPoint *)(plVar19 + 2);
                  if ((BRDPoint *)*plVar19 == pBVar22) {
                    local_1c8 = *pBVar22;
                    ppStack_1c0 = (pointer)plVar19[3];
                    auStack_1e0._8_8_ = &local_1c8;
                  }
                  else {
                    local_1c8 = *pBVar22;
                    auStack_1e0._8_8_ = (BRDPoint *)*plVar19;
                  }
                  local_1d0 = (pointer)plVar19[1];
                  *plVar19 = (long)pBVar22;
                  plVar19[1] = 0;
                  *(undefined1 *)&pBVar22->x = 0;
                  plVar19 = (long *)std::__cxx11::string::append(auStack_1e0 + 8);
                  psVar27 = (size_type *)(plVar19 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar19 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar27) {
                    local_230._M_allocated_capacity = *psVar27;
                    local_230._8_8_ = plVar19[3];
                    local_278._56_8_ = &local_230;
                  }
                  else {
                    local_230._M_allocated_capacity = *psVar27;
                    local_278._56_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*plVar19;
                  }
                  local_238 = plVar19[1];
                  *plVar19 = (long)psVar27;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  puVar20 = (undefined8 *)std::__cxx11::string::append(local_278 + 0x38);
                  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
                  psVar27 = puVar20 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar20 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar27) {
                    local_220.field_2._M_allocated_capacity = *psVar27;
                    local_220.field_2._8_8_ = puVar20[3];
                  }
                  else {
                    local_220.field_2._M_allocated_capacity = *psVar27;
                    local_220._M_dataplus._M_p = (pointer)*puVar20;
                  }
                  local_220._M_string_length = puVar20[1];
                  *puVar20 = psVar27;
                  puVar20[1] = 0;
                  *(undefined1 *)(puVar20 + 2) = 0;
                  plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_1f8._0_8_ = &local_1e8;
                  pp_Var25 = (_func_int **)(plVar19 + 2);
                  if ((_func_int **)*plVar19 == pp_Var25) {
                    local_1e8 = *pp_Var25;
                    auStack_1e0._0_8_ = plVar19[3];
                  }
                  else {
                    local_1e8 = *pp_Var25;
                    local_1f8._0_8_ = (_func_int **)*plVar19;
                  }
                  local_1f8._8_8_ = plVar19[1];
                  *plVar19 = (long)pp_Var25;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  puVar20 = (undefined8 *)std::__cxx11::string::append(local_1f8);
                  pBVar39 = (pointer)(puVar20 + 2);
                  if ((pointer)*puVar20 == pBVar39) {
                    local_278._0_8_ = pBVar39->name;
                    local_278._8_8_ = puVar20[3];
                    local_288._0_8_ = (pointer)local_278;
                  }
                  else {
                    local_278._0_8_ = pBVar39->name;
                    local_288._0_8_ = (pointer)*puVar20;
                  }
                  local_288._8_8_ = puVar20[1];
                  *puVar20 = pBVar39;
                  puVar20[1] = 0;
                  *(undefined1 *)(puVar20 + 2) = 0;
                  puVar20 = (undefined8 *)std::__cxx11::string::append(local_288);
                  ppcVar26 = (char **)(puVar20 + 2);
                  if ((char **)*puVar20 == ppcVar26) {
                    local_2a8._16_8_ = *ppcVar26;
                    local_2a8._24_8_ = puVar20[3];
                    local_2a8._0_8_ = local_2a8 + 0x10;
                  }
                  else {
                    local_2a8._16_8_ = *ppcVar26;
                    local_2a8._0_8_ = (char **)*puVar20;
                  }
                  local_2a8._8_8_ = puVar20[1];
                  *puVar20 = ppcVar26;
                  puVar20[1] = 0;
                  *(undefined1 *)(puVar20 + 2) = 0;
                  std::__cxx11::string::operator=(local_110,(string *)local_2a8);
                  if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
                    operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
                  }
                  if ((pointer)local_288._0_8_ != (pointer)local_278) {
                    operator_delete((void *)local_288._0_8_,(ulong)(local_278._0_8_ + 1));
                  }
                  if ((_func_int **)local_1f8._0_8_ != &local_1e8) {
                    operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8 + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p != &local_220.field_2) {
                    operator_delete(local_220._M_dataplus._M_p,
                                    local_220.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._56_8_ != &local_230) {
                    operator_delete((void *)local_278._56_8_,local_230._M_allocated_capacity + 1);
                  }
                  if ((BRDPoint *)auStack_1e0._8_8_ != &local_1c8) {
                    operator_delete((void *)auStack_1e0._8_8_,(long)local_1c8 + 1);
                  }
                  if ((ulong *)local_100._8_8_ != local_e8) {
                    operator_delete((void *)local_100._8_8_,local_e8[0] + 1);
                  }
                  if ((undefined1 *)local_278._24_8_ != local_278 + 0x28) {
                    operator_delete((void *)local_278._24_8_,local_278._40_8_ + 1);
                  }
                  if (local_b8[0] != local_a8) {
                    operator_delete(local_b8[0],local_a8[0] + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_110);
                }
                pbVar40 = local_200;
                local_1a8._16_4_ = (int)lVar18;
                bVar3 = *local_200;
                pbVar29 = pbVar40;
                if ((bVar3 != 0) && (iVar11 = isspace((uint)bVar3), bVar3 != 9)) {
                  while (pbVar29 = pbVar40, iVar11 != 0) {
                    pbVar40 = pbVar40 + 1;
                    bVar3 = *pbVar40;
                    pbVar29 = pbVar40;
                    if ((bVar3 == 0) || (iVar11 = isspace((uint)bVar3), bVar3 == 9)) break;
                  }
                }
                for (; (local_200 = pbVar29, pbVar29 = local_200, *pbVar40 != 0 && (*pbVar40 != 9));
                    pbVar40 = pbVar40 + 1) {
                }
                *pbVar40 = 0;
                local_200 = pbVar40 + 1;
                pcVar12 = fix_to_utf8((char *)pbVar29,(char **)&local_118,(char *)local_1b0);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,pcVar12,(allocator<char> *)local_1f8);
                split_string((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_288,&local_50);
                local_2a8._16_8_ = auStack_190._16_8_;
                local_2a8._8_8_ = auStack_190._8_8_;
                local_2a8._0_8_ = auStack_190._0_8_;
                auStack_190._0_8_ = local_288._0_8_;
                auStack_190._8_8_ = local_288._8_8_;
                auStack_190._16_8_ = local_278._0_8_;
                local_288._0_8_ = (pointer)0x0;
                local_288._8_8_ = (pointer)0x0;
                local_278._0_8_ = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2a8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_288);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                pbVar40 = local_200;
                bVar3 = *local_200;
                if ((bVar3 != 0) && (iVar11 = isspace((uint)bVar3), bVar3 != 9)) {
                  while (iVar11 != 0) {
                    pbVar40 = pbVar40 + 1;
                    bVar3 = *pbVar40;
                    if ((bVar3 == 0) || (iVar11 = isspace((uint)bVar3), bVar3 == 9)) break;
                  }
                }
                local_200 = pbVar40;
                pbVar40 = local_200;
                for (; (*local_200 != 0 && (*local_200 != 9)); local_200 = local_200 + 1) {
                }
                *local_200 = 0;
                local_200 = local_200 + 1;
                pcVar12 = fix_to_utf8((char *)pbVar40,(char **)&local_118,(char *)local_1b0);
                auStack_190._24_4_ = SUB84(pcVar12,0);
                auStack_190._28_4_ = (undefined4)((ulong)pcVar12 >> 0x20);
                std::vector<FZPartDesc,_std::allocator<FZPartDesc>_>::push_back
                          ((vector<FZPartDesc,_std::allocator<FZPartDesc>_> *)local_120,
                           (value_type *)local_1a8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_190);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 < (ulong)((long)local_d8.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_d8.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3));
          }
          pFVar33 = (local_1b8->partsDesc).
                    super__Vector_base<FZPartDesc,_std::allocator<FZPartDesc>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_120 = (local_1b8->partsDesc).
                      super__Vector_base<FZPartDesc,_std::allocator<FZPartDesc>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          this_00 = local_1b8;
          if (pFVar33 != local_120) {
            do {
              pbVar5 = (pFVar33->locations).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar41 = (pFVar33->locations).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar41 != pbVar5;
                  pbVar41 = pbVar41 + 1) {
                iVar21 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_160,pbVar41);
                if (iVar21.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                    ._M_cur != (__node_type *)0x0) {
                  uVar35 = (long)*(int *)((long)iVar21.
                                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                                ._M_cur + 0x28) - 1;
                  pBVar39 = (this_00->super_BRDFileBase).parts.
                            super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar37 = ((long)(this_00->super_BRDFileBase).parts.
                                  super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pBVar39 >> 3) *
                           -0x71c71c71c71c71c7;
                  if (uVar37 < uVar35 || uVar37 - uVar35 == 0) {
                    uVar23 = std::__throw_out_of_range_fmt
                                       (
                                       "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       );
                    if (local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_d8.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_d8.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_98.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_98.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_98.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_98.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   *)local_160);
                    _Unwind_Resume(uVar23);
                  }
                  pcVar12 = pFVar33->description;
                  pcVar6 = (char *)pBVar39[uVar35].mfgcode._M_string_length;
                  strlen(pcVar12);
                  std::__cxx11::string::_M_replace
                            ((ulong)&pBVar39[uVar35].mfgcode,0,pcVar6,(ulong)pcVar12);
                  this_00 = local_1b8;
                }
              }
              pFVar33 = pFVar33 + 1;
            } while (pFVar33 != local_120);
          }
          pBVar7 = (this_00->super_BRDFileBase).pins.
                   super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar18 = (long)(this_00->super_BRDFileBase).pins.
                         super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pBVar7;
          if (lVar18 != 0) {
            lVar18 = (lVar18 >> 3) * 0x6db6db6db6db6db7;
            pBVar39 = (this_00->super_BRDFileBase).parts.
                      super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar16 = &pBVar7->part;
            lVar36 = 0;
            do {
              if (*puVar16 != 0) {
                pBVar39[*puVar16 - 1].end_of_pins = (uint)lVar36;
              }
              lVar36 = lVar36 + 1;
              puVar16 = puVar16 + 0xe;
            } while (lVar18 + (ulong)(lVar18 == 0) != lVar36);
          }
          gen_outline(this_00);
          update_counts(this_00);
          setlocale(1,local_58);
          (this_00->super_BRDFileBase).valid = SUB81(local_128,0);
          if (SUB81(local_128,0) == false) {
            fz_key_to_string<44ul>((string *)local_2a8,local_60,fzkey_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,"FZ Key:\n",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2a8);
            std::__cxx11::string::_M_append
                      ((char *)&(this_00->super_BRDFileBase).error_msg,local_1a8._0_8_);
            if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
              operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
            }
          }
          if (local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_98.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_98.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_160);
          return;
        }
        auStack_1e0._8_8_ = &local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(auStack_1e0 + 8),
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                   ,"");
        puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1e0 + 8);
        local_278._56_8_ = &local_230;
        puVar24 = puVar20 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar20 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_230._M_allocated_capacity = *puVar24;
          local_230._8_8_ = puVar20[3];
        }
        else {
          local_230._M_allocated_capacity = *puVar24;
          local_278._56_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar20;
        }
        local_238 = puVar20[1];
        *puVar20 = puVar24;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        std::__cxx11::to_string((string *)(local_278 + 0x18),0x11f);
        std::operator+(&local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_278 + 0x38),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_278 + 0x18));
        puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
        local_1f8._0_8_ = &local_1e8;
        pp_Var25 = (_func_int **)(puVar20 + 2);
        if ((_func_int **)*puVar20 == pp_Var25) {
          local_1e8 = *pp_Var25;
          auStack_1e0._0_8_ = puVar20[3];
        }
        else {
          local_1e8 = *pp_Var25;
          local_1f8._0_8_ = (_func_int **)*puVar20;
        }
        local_1f8._8_8_ = puVar20[1];
        *puVar20 = pp_Var25;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append(local_1f8);
        local_288._0_8_ = local_278;
        pbVar41 = (pointer)(plVar19 + 2);
        if ((pointer)*plVar19 == pbVar41) {
          local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
          local_278._8_8_ = plVar19[3];
        }
        else {
          local_278._0_8_ = (pbVar41->_M_dataplus)._M_p;
          local_288._0_8_ = (pointer)*plVar19;
        }
        local_288._8_8_ = plVar19[1];
        *plVar19 = (long)pbVar41;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        puVar20 = (undefined8 *)std::__cxx11::string::append(local_288);
        local_2a8._0_8_ = local_2a8 + 0x10;
        ppcVar26 = (char **)(puVar20 + 2);
        if ((char **)*puVar20 == ppcVar26) {
          local_2a8._16_8_ = *ppcVar26;
          local_2a8._24_8_ = puVar20[3];
        }
        else {
          local_2a8._16_8_ = *ppcVar26;
          local_2a8._0_8_ = (char **)*puVar20;
        }
        local_2a8._8_8_ = puVar20[1];
        *puVar20 = ppcVar26;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        puVar20 = (undefined8 *)std::__cxx11::string::append(local_2a8);
        local_160._0_8_ = local_160 + 0x10;
        psVar27 = puVar20 + 2;
        if ((size_type *)*puVar20 == psVar27) {
          local_160._16_8_ = *psVar27;
          local_160._24_8_ = puVar20[3];
        }
        else {
          local_160._16_8_ = *psVar27;
          local_160._0_8_ = (size_type *)*puVar20;
        }
        local_160._8_8_ = puVar20[1];
        *puVar20 = psVar27;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        pBVar22 = (BRDPoint *)std::__cxx11::string::append(local_160);
      }
    }
    BVar28 = (BRDPoint)(pBVar22 + 2);
    if (*pBVar22 == BVar28) {
      local_1a8._16_8_ = *(undefined8 *)BVar28;
      auStack_190._0_8_ = pBVar22[3];
      local_1a8._0_8_ = (long)local_1a8 + 0x10;
    }
    else {
      local_1a8._16_8_ = *(undefined8 *)BVar28;
      local_1a8._0_8_ = *pBVar22;
    }
    local_1a8._8_8_ = pBVar22[1];
    *pBVar22 = BVar28;
    pBVar22[1].x = 0;
    pBVar22[1].y = 0;
    *(undefined1 *)&pBVar22[2].x = 0;
    psVar32 = &(local_1b8->super_BRDFileBase).error_msg;
    std::__cxx11::string::operator=((string *)psVar32,(string *)local_1a8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
      operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
    }
    if ((pointer)local_288._0_8_ != (pointer)local_278) {
      operator_delete((void *)local_288._0_8_,(ulong)(local_278._0_8_ + 1));
    }
    if ((_func_int **)local_1f8._0_8_ != &local_1e8) {
      operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_278._24_8_ != local_278 + 0x28) {
      operator_delete((void *)local_278._24_8_,local_278._40_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._56_8_ != &local_230) {
      operator_delete((void *)local_278._56_8_,local_230._M_allocated_capacity + 1);
    }
    if ((BRDPoint *)auStack_1e0._8_8_ == &local_1c8) goto LAB_00148395;
  }
  operator_delete((void *)auStack_1e0._8_8_,(long)local_1c8 + 1);
LAB_00148395:
  SDL_LogError(1,"%s",(psVar32->_M_dataplus)._M_p);
  return;
}

Assistant:

void FZFile::parse(std::vector<char> &buf, const std::array<uint32_t, 44> &fzkey) {
	auto buffer_size = buf.size();
	char *saved_locale;
	float multiplier = 1.0f;
	saved_locale     = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	if (check_fz_key(fzkey)) {
		key = fzkey;
	} else if (!check_fz_key(key)) { // Try to fallback to built-in key
		valid = false;
		error_msg = getKeyErrorMsg();
		error_msg += fz_key_to_string(fzkey);
		return;
	}

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	/*
	 * Some non-encrypted, but zip-encoded files are popping up now and then.
	 *
	 * Thanks to piernov for noticing the starting byte sequence
	 *
	 * Attempt to decode using the decode() call and subsequently
	 * split the file to get the content.  If that fails, then try again
	 * without decoding.
	 */

	uint8_t s1 = file_buf[4];
	uint8_t s2 = file_buf[5];
	if (!((s1 == 0x78) && ((s2 == 0x9C) || (s2 == 0xDA)))) {

		/*
		 * Doesn't have the zlib signature, so decode it first.
		 *
		 * 1 in ~2^16 chance of a false hit.
		 */
		FZFile::decode(file_buf, buffer_size); // RC6 decryption
		                                       // fprintf(stderr,"FZFile:Decoded\n");
	}

	size_t content_size = 0;
	size_t descr_size   = 0;
	char *descr;
	char *content = FZFile::split(file_buf, buffer_size, content_size, descr, descr_size); // then split it

	/*
  if (!content) {
	 // Decryption must have failed, so try again now without decrypting the data
	std::copy(buf.begin(), buf.end(), file_buf);
	content = FZFile::split(file_buf, buffer_size, content_size, descr, descr_size); // then split it
  }
  */

	ENSURE_OR_FAIL(content != nullptr, error_msg, return);
	ENSURE_OR_FAIL(content_size > 0, error_msg, return);
	content = FZFile::decompress(content, content_size, content_size); // decompress zlib content data
	ENSURE_OR_FAIL(content != nullptr, error_msg, return);
	ENSURE_OR_FAIL(content_size > 0, error_msg, return);

	ENSURE_OR_FAIL(content != descr, error_msg, return);
	ENSURE_OR_FAIL(descr_size > 0, error_msg, return);
	descr = FZFile::decompress(descr, descr_size, descr_size);
	ENSURE_OR_FAIL(descr != nullptr, error_msg, return);
	ENSURE_OR_FAIL(descr_size > 0, error_msg, return);

	int current_block = 0;
	std::unordered_map<std::string, int> parts_id; // map between part name and part number

	std::vector<char *> lines_content;
	stringfile(content, lines_content);

	std::vector<char *> lines_descr;
	stringfile(descr, lines_descr);

	// For some reason, some boards have COMMAs as decimal separators. Will wonders ever cease ( I realise this is a regional thing
	// )?
	std::replace(content, content + content_size, ',', '.');

	// Parse the content part (parts, pins, nails)

	for (char *line : lines_content) {
		//	fprintf(stdout,"%s\n", line);

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		/*
		 * If we have a UNIT: line in the data, see if it's requesting millimeters and scale appropriatley.
		 * Default is units are thou (0.001")
		 */
		if (!strcmp(line, "UNIT:millimeters")) {
			multiplier = 25.4f;
		}

		if (line[0] == 'A') { // New block
			line += 2;        // skip "A!"
			if (!strncmp(line, "REFDES", 6)) {
				current_block = 1;
			} else if (!strncmp(line, "NET_NAME", 8)) {
				current_block = 2;
			} else if (!strncmp(line, "TESTVIA", 7)) {
				current_block = 3;
			} else if (!strncmp(line, "GRAPHIC_DATA_NAME", 17)) {
				current_block = 4;
			} else if (!strncmp(line, "CLASS", 5)) {
				current_block = 5;
			} else if (!strncmp(line, "LOGOInfo", 8)) {
				current_block = 6;
			} else if (!strncmp(line, "UnDrawSym", 9)) {
				current_block = 7;
			} else {
				current_block = -1;
			}
			continue;
		} else if (line[0] != 'S') // Unknown line type
			continue;              // jump to next line
		else
			p += 2; // Skip "S!"

		switch (current_block) {
			case 1: { // Parts
				BRDPart part;
				part.name = READ_STR();
				/*char *cic =*/READ_STR();
				/*char *sname =*/READ_STR();
				char *smirror = READ_STR();
				/*char *srotate =*/READ_STR();
				part.part_type = BRDPartType::SMD;
				if (!strcmp(smirror, "YES"))
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				part.end_of_pins       = 0;
				parts.push_back(part);
				parts_id[part.name] = parts.size();
			} break;
			case 2: { // Pins
				/* There are more then single FZ file variant even if all those files ahre same header looking like
				A!NET_NAME!REFDES!PIN_NUMBER!PIN_NAME!PIN_X!PIN_Y!TEST_POINT!RADIUS!

				There are at least 2 variants, placing BGA pin label in different places:
				S!SATA_GP1!SU1!AJ43!GPP_E1/SATAXPCIE1/SATAGP1!3315.86!1830.70!!6!
				S!SNN_FBA_WCKB45*!G1!0!AJ31!3140.51!1436.167!!7.48106!

				For first variant the PIN_NAME column is ignored until thre would be a filed for handling/displaying such info
				But for second varinat the PIN_NUMBER column is always the "0" literal, so PIN_NAME is used as name.
				*/
				BRDPin pin;
				pin.net    = READ_STR();
				char *part = READ_STR();
				pin.part   = parts_id.at(part);
				pin.snum   = READ_STR();
				char *name = READ_STR();

				// use name field as pin name if snum is empty string or "0" (decimal zero as string)
				bool name_is_pin_position_id = strlen(pin.snum) <= 1 && (pin.snum[0] == '\0' or pin.snum[0] == '0');
				if (name_is_pin_position_id)
				{
					pin.name = name;
				}
				double posx   = READ_DOUBLE();
				pin.pos.x     = posx * multiplier;
				double posy   = READ_DOUBLE();
				pin.pos.y     = posy * multiplier;
				pin.probe     = READ_UINT();
				double radius = READ_DOUBLE();
				radius /= 100;
				if (radius < 0.5f) radius = 0.5f;
				pin.radius                = radius * multiplier;
				switch (parts[pin.part - 1].mounting_side) {
					case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
					case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
					case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
				}
				pins.push_back(pin);
			} break;
			case 3: {   // Nails
				p += 2; // Skip "Y!"
				BRDNail nail;
				nail.net = READ_STR();
				/*char *refdes =*/READ_STR();
				/*int pinnumber =*/READ_INT(); // uint
				/*char *pinname =*/READ_STR();

				double posx = READ_DOUBLE();
				nail.pos.x  = posx * multiplier;
				double posy = READ_DOUBLE();
				nail.pos.y  = posy * multiplier;
				char *loc   = READ_STR();
				if (!strcmp(loc, "T"))
					nail.side = BRDPartMountingSide::Top;
				else
					nail.side = BRDPartMountingSide::Bottom;
				/*double radius =*/READ_DOUBLE();
				nails.push_back(nail);
			} break;
			case 4: { // Drawing
			} break;
			case 5: { // Unknown
			} break;
			case 6: { // Logo/Info
			} break;
			case 7: { // Unknown
			} break;
		}
	}

	// Parse the descr part (parts info)
	// Note: Discard first 2 lines (board description, currently unused and table columns name)
	for (size_t i = 2; i < lines_descr.size(); ++i) {
		char *line = lines_descr[i];

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (line[0] == 's') continue; // PARTNUMBER starting with 's' seems unused

		FZPartDesc pdesc;
		pdesc.partno      = READ_DESCR_STR();
		pdesc.description = READ_DESCR_STR();
		pdesc.quantity    = READ_DESCR_UINT();
		pdesc.locations   = split_string(READ_DESCR_STR());
		pdesc.partno2     = READ_DESCR_STR();
		partsDesc.push_back(pdesc);
	}

	for (auto &pdesc : partsDesc) {
		for (auto &partname : pdesc.locations) {
			auto iter = parts_id.find(partname);
			if (iter != parts_id.end()) { // Sometimes the desc part references stuff not in content part, ignore it
				parts.at(iter->second - 1).mfgcode = pdesc.description;
			}
		}
	}

	//	std::sort(pins.begin(), pins.end()); // sort vector by part num then pin num
	for (std::vector<int>::size_type i = 0; i < pins.size(); i++) {
		// update end_of_pins field
		if (pins[i].part > 0) parts[pins[i].part - 1].end_of_pins = i;
	}

	gen_outline();

	update_counts();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = current_block != 0;

	if (!valid) {
		error_msg += "FZ Key:\n" + fz_key_to_string(key);
	}
}